

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_compile(sha256_ctx *ctx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  sha2_32t local_6c;
  sha2_32t local_68;
  sha2_32t local_64;
  sha2_32t local_60;
  sha2_32t local_5c;
  sha2_32t local_58;
  sha2_32t local_54;
  sha2_32t local_50;
  sha2_32t local_4c;
  sha2_32t local_48;
  sha2_32t local_44;
  sha2_32t local_40;
  sha2_32t local_3c;
  sha2_32t local_38;
  sha2_32t local_34;
  sha2_32t local_30;
  sha2_32t j;
  sha2_32t v [8];
  sha256_ctx *ctx_local;
  
  v._0_8_ = *(undefined8 *)ctx->hash;
  v._8_8_ = *(undefined8 *)(ctx->hash + 2);
  v._16_8_ = *(undefined8 *)(ctx->hash + 4);
  v._24_8_ = *(undefined8 *)(ctx->hash + 6);
  for (j = 0; j < 0x40; j = j + 0x10) {
    if (j == 0) {
      local_30 = ctx->wbuf[0];
    }
    else {
      local_30 = ((ctx->wbuf[0xe] >> 0x11 | ctx->wbuf[0xe] << 0xf) ^
                  (ctx->wbuf[0xe] >> 0x13 | ctx->wbuf[0xe] << 0xd) ^ ctx->wbuf[0xe] >> 10) +
                 ctx->wbuf[9] +
                 ((ctx->wbuf[1] >> 7 | ctx->wbuf[1] << 0x19) ^
                  (ctx->wbuf[1] >> 0x12 | ctx->wbuf[1] << 0xe) ^ ctx->wbuf[1] >> 3) + ctx->wbuf[0];
      ctx->wbuf[0] = local_30;
    }
    iVar1 = local_30 + k256[j] +
            ((v[4] >> 6 | v[4] << 0x1a) ^ (v[4] >> 0xb | v[4] << 0x15) ^ (v[4] >> 0x19 | v[4] << 7))
            + (v[4] & v[5] ^ (v[4] ^ 0xffffffff) & v[6]) + v[7];
    uVar2 = iVar1 + v[3];
    uVar3 = ((v[0] >> 2 | v[0] << 0x1e) ^ (v[0] >> 0xd | v[0] << 0x13) ^ (v[0] >> 0x16 | v[0] << 10)
            ) + (v[0] & v[1] ^ v[0] & v[2] ^ v[1] & v[2]) + iVar1;
    if (j == 0) {
      local_34 = ctx->wbuf[1];
    }
    else {
      local_34 = ((ctx->wbuf[0xf] >> 0x11 | ctx->wbuf[0xf] << 0xf) ^
                  (ctx->wbuf[0xf] >> 0x13 | ctx->wbuf[0xf] << 0xd) ^ ctx->wbuf[0xf] >> 10) +
                 ctx->wbuf[10] +
                 ((ctx->wbuf[2] >> 7 | ctx->wbuf[2] << 0x19) ^
                  (ctx->wbuf[2] >> 0x12 | ctx->wbuf[2] << 0xe) ^ ctx->wbuf[2] >> 3) + ctx->wbuf[1];
      ctx->wbuf[1] = local_34;
    }
    iVar1 = local_34 + k256[j + 1] +
            ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
            (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar2 & v[4] ^ (uVar2 ^ 0xffffffff) & v[5]) + v[6];
    uVar4 = iVar1 + v[2];
    uVar5 = ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
            (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & v[0] ^ uVar3 & v[1] ^ v[0] & v[1]) + iVar1;
    if (j == 0) {
      local_38 = ctx->wbuf[2];
    }
    else {
      local_38 = ((ctx->wbuf[0] >> 0x11 | ctx->wbuf[0] << 0xf) ^
                  (ctx->wbuf[0] >> 0x13 | ctx->wbuf[0] << 0xd) ^ ctx->wbuf[0] >> 10) +
                 ctx->wbuf[0xb] +
                 ((ctx->wbuf[3] >> 7 | ctx->wbuf[3] << 0x19) ^
                  (ctx->wbuf[3] >> 0x12 | ctx->wbuf[3] << 0xe) ^ ctx->wbuf[3] >> 3) + ctx->wbuf[2];
      ctx->wbuf[2] = local_38;
    }
    iVar1 = local_38 + k256[j + 2] +
            ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & v[4]) + v[5];
    uVar6 = iVar1 + v[1];
    uVar7 = ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
            (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 ^ uVar5 & v[0] ^ uVar3 & v[0]) + iVar1
    ;
    if (j == 0) {
      local_3c = ctx->wbuf[3];
    }
    else {
      local_3c = ((ctx->wbuf[1] >> 0x11 | ctx->wbuf[1] << 0xf) ^
                  (ctx->wbuf[1] >> 0x13 | ctx->wbuf[1] << 0xd) ^ ctx->wbuf[1] >> 10) +
                 ctx->wbuf[0xc] +
                 ((ctx->wbuf[4] >> 7 | ctx->wbuf[4] << 0x19) ^
                  (ctx->wbuf[4] >> 0x12 | ctx->wbuf[4] << 0xe) ^ ctx->wbuf[4] >> 3) + ctx->wbuf[3];
      ctx->wbuf[3] = local_3c;
    }
    iVar1 = local_3c + k256[j + 3] +
            ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
            (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar6 & uVar4 ^ (uVar6 ^ 0xffffffff) & uVar2) + v[4];
    uVar8 = iVar1 + v[0];
    uVar9 = ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
            (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 ^ uVar7 & uVar3 ^ uVar5 & uVar3) +
            iVar1;
    if (j == 0) {
      local_40 = ctx->wbuf[4];
    }
    else {
      local_40 = ((ctx->wbuf[2] >> 0x11 | ctx->wbuf[2] << 0xf) ^
                  (ctx->wbuf[2] >> 0x13 | ctx->wbuf[2] << 0xd) ^ ctx->wbuf[2] >> 10) +
                 ctx->wbuf[0xd] +
                 ((ctx->wbuf[5] >> 7 | ctx->wbuf[5] << 0x19) ^
                  (ctx->wbuf[5] >> 0x12 | ctx->wbuf[5] << 0xe) ^ ctx->wbuf[5] >> 3) + ctx->wbuf[4];
      ctx->wbuf[4] = local_40;
    }
    iVar1 = local_40 + k256[j + 4] +
            ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
            (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar8 & uVar6 ^ (uVar8 ^ 0xffffffff) & uVar4) + uVar2
    ;
    uVar3 = iVar1 + uVar3;
    uVar2 = ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
            (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 ^ uVar9 & uVar5 ^ uVar7 & uVar5) +
            iVar1;
    if (j == 0) {
      local_44 = ctx->wbuf[5];
    }
    else {
      local_44 = ((ctx->wbuf[3] >> 0x11 | ctx->wbuf[3] << 0xf) ^
                  (ctx->wbuf[3] >> 0x13 | ctx->wbuf[3] << 0xd) ^ ctx->wbuf[3] >> 10) +
                 ctx->wbuf[0xe] +
                 ((ctx->wbuf[6] >> 7 | ctx->wbuf[6] << 0x19) ^
                  (ctx->wbuf[6] >> 0x12 | ctx->wbuf[6] << 0xe) ^ ctx->wbuf[6] >> 3) + ctx->wbuf[5];
      ctx->wbuf[5] = local_44;
    }
    iVar1 = local_44 + k256[j + 5] +
            ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
            (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar3 & uVar8 ^ (uVar3 ^ 0xffffffff) & uVar6) + uVar4
    ;
    uVar5 = iVar1 + uVar5;
    uVar4 = ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
            (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 ^ uVar2 & uVar7 ^ uVar9 & uVar7) +
            iVar1;
    if (j == 0) {
      local_48 = ctx->wbuf[6];
    }
    else {
      local_48 = ((ctx->wbuf[4] >> 0x11 | ctx->wbuf[4] << 0xf) ^
                  (ctx->wbuf[4] >> 0x13 | ctx->wbuf[4] << 0xd) ^ ctx->wbuf[4] >> 10) +
                 ctx->wbuf[0xf] +
                 ((ctx->wbuf[7] >> 7 | ctx->wbuf[7] << 0x19) ^
                  (ctx->wbuf[7] >> 0x12 | ctx->wbuf[7] << 0xe) ^ ctx->wbuf[7] >> 3) + ctx->wbuf[6];
      ctx->wbuf[6] = local_48;
    }
    iVar1 = local_48 + k256[j + 6] +
            ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
            (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar5 & uVar3 ^ (uVar5 ^ 0xffffffff) & uVar8) + uVar6
    ;
    uVar7 = iVar1 + uVar7;
    uVar6 = ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
            (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 ^ uVar4 & uVar9 ^ uVar2 & uVar9) +
            iVar1;
    if (j == 0) {
      local_4c = ctx->wbuf[7];
    }
    else {
      local_4c = ((ctx->wbuf[5] >> 0x11 | ctx->wbuf[5] << 0xf) ^
                  (ctx->wbuf[5] >> 0x13 | ctx->wbuf[5] << 0xd) ^ ctx->wbuf[5] >> 10) + ctx->wbuf[0]
                 + ((ctx->wbuf[8] >> 7 | ctx->wbuf[8] << 0x19) ^
                    (ctx->wbuf[8] >> 0x12 | ctx->wbuf[8] << 0xe) ^ ctx->wbuf[8] >> 3) + ctx->wbuf[7]
      ;
      ctx->wbuf[7] = local_4c;
    }
    iVar1 = local_4c + k256[j + 7] +
            ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
            (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar7 & uVar5 ^ (uVar7 ^ 0xffffffff) & uVar3) + uVar8
    ;
    uVar9 = iVar1 + uVar9;
    uVar8 = ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
            (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 ^ uVar6 & uVar2 ^ uVar4 & uVar2) +
            iVar1;
    if (j == 0) {
      local_50 = ctx->wbuf[8];
    }
    else {
      local_50 = ((ctx->wbuf[6] >> 0x11 | ctx->wbuf[6] << 0xf) ^
                  (ctx->wbuf[6] >> 0x13 | ctx->wbuf[6] << 0xd) ^ ctx->wbuf[6] >> 10) + ctx->wbuf[1]
                 + ((ctx->wbuf[9] >> 7 | ctx->wbuf[9] << 0x19) ^
                    (ctx->wbuf[9] >> 0x12 | ctx->wbuf[9] << 0xe) ^ ctx->wbuf[9] >> 3) + ctx->wbuf[8]
      ;
      ctx->wbuf[8] = local_50;
    }
    iVar1 = local_50 + k256[j + 8] +
            ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
            (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar9 & uVar7 ^ (uVar9 ^ 0xffffffff) & uVar5) + uVar3
    ;
    uVar2 = iVar1 + uVar2;
    uVar3 = ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
            (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 ^ uVar8 & uVar4 ^ uVar6 & uVar4) +
            iVar1;
    if (j == 0) {
      local_54 = ctx->wbuf[9];
    }
    else {
      local_54 = ((ctx->wbuf[7] >> 0x11 | ctx->wbuf[7] << 0xf) ^
                  (ctx->wbuf[7] >> 0x13 | ctx->wbuf[7] << 0xd) ^ ctx->wbuf[7] >> 10) + ctx->wbuf[2]
                 + ((ctx->wbuf[10] >> 7 | ctx->wbuf[10] << 0x19) ^
                    (ctx->wbuf[10] >> 0x12 | ctx->wbuf[10] << 0xe) ^ ctx->wbuf[10] >> 3) +
                 ctx->wbuf[9];
      ctx->wbuf[9] = local_54;
    }
    iVar1 = local_54 + k256[j + 9] +
            ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
            (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar2 & uVar9 ^ (uVar2 ^ 0xffffffff) & uVar7) + uVar5
    ;
    uVar4 = iVar1 + uVar4;
    uVar5 = ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
            (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 ^ uVar3 & uVar6 ^ uVar8 & uVar6) +
            iVar1;
    if (j == 0) {
      local_58 = ctx->wbuf[10];
    }
    else {
      local_58 = ((ctx->wbuf[8] >> 0x11 | ctx->wbuf[8] << 0xf) ^
                  (ctx->wbuf[8] >> 0x13 | ctx->wbuf[8] << 0xd) ^ ctx->wbuf[8] >> 10) + ctx->wbuf[3]
                 + ((ctx->wbuf[0xb] >> 7 | ctx->wbuf[0xb] << 0x19) ^
                    (ctx->wbuf[0xb] >> 0x12 | ctx->wbuf[0xb] << 0xe) ^ ctx->wbuf[0xb] >> 3) +
                 ctx->wbuf[10];
      ctx->wbuf[10] = local_58;
    }
    iVar1 = local_58 + k256[j + 10] +
            ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
            (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar9) + uVar7
    ;
    uVar6 = iVar1 + uVar6;
    uVar7 = ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
            (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 ^ uVar5 & uVar8 ^ uVar3 & uVar8) +
            iVar1;
    if (j == 0) {
      local_5c = ctx->wbuf[0xb];
    }
    else {
      local_5c = ((ctx->wbuf[9] >> 0x11 | ctx->wbuf[9] << 0xf) ^
                  (ctx->wbuf[9] >> 0x13 | ctx->wbuf[9] << 0xd) ^ ctx->wbuf[9] >> 10) + ctx->wbuf[4]
                 + ((ctx->wbuf[0xc] >> 7 | ctx->wbuf[0xc] << 0x19) ^
                    (ctx->wbuf[0xc] >> 0x12 | ctx->wbuf[0xc] << 0xe) ^ ctx->wbuf[0xc] >> 3) +
                 ctx->wbuf[0xb];
      ctx->wbuf[0xb] = local_5c;
    }
    iVar1 = local_5c + k256[j + 0xb] +
            ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
            (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar6 & uVar4 ^ (uVar6 ^ 0xffffffff) & uVar2) + uVar9
    ;
    uVar8 = iVar1 + uVar8;
    uVar9 = ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
            (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 ^ uVar7 & uVar3 ^ uVar5 & uVar3) +
            iVar1;
    if (j == 0) {
      local_60 = ctx->wbuf[0xc];
    }
    else {
      local_60 = ((ctx->wbuf[10] >> 0x11 | ctx->wbuf[10] << 0xf) ^
                  (ctx->wbuf[10] >> 0x13 | ctx->wbuf[10] << 0xd) ^ ctx->wbuf[10] >> 10) +
                 ctx->wbuf[5] +
                 ((ctx->wbuf[0xd] >> 7 | ctx->wbuf[0xd] << 0x19) ^
                  (ctx->wbuf[0xd] >> 0x12 | ctx->wbuf[0xd] << 0xe) ^ ctx->wbuf[0xd] >> 3) +
                 ctx->wbuf[0xc];
      ctx->wbuf[0xc] = local_60;
    }
    iVar1 = local_60 + k256[j + 0xc] +
            ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
            (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar8 & uVar6 ^ (uVar8 ^ 0xffffffff) & uVar4) + uVar2
    ;
    v[7] = iVar1 + uVar3;
    v[3] = ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
           (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 ^ uVar9 & uVar5 ^ uVar7 & uVar5) +
           iVar1;
    if (j == 0) {
      local_64 = ctx->wbuf[0xd];
    }
    else {
      local_64 = ((ctx->wbuf[0xb] >> 0x11 | ctx->wbuf[0xb] << 0xf) ^
                  (ctx->wbuf[0xb] >> 0x13 | ctx->wbuf[0xb] << 0xd) ^ ctx->wbuf[0xb] >> 10) +
                 ctx->wbuf[6] +
                 ((ctx->wbuf[0xe] >> 7 | ctx->wbuf[0xe] << 0x19) ^
                  (ctx->wbuf[0xe] >> 0x12 | ctx->wbuf[0xe] << 0xe) ^ ctx->wbuf[0xe] >> 3) +
                 ctx->wbuf[0xd];
      ctx->wbuf[0xd] = local_64;
    }
    iVar1 = local_64 + k256[j + 0xd] +
            ((v[7] >> 6 | v[7] * 0x4000000) ^ (v[7] >> 0xb | v[7] * 0x200000) ^
            (v[7] >> 0x19 | v[7] * 0x80)) + (v[7] & uVar8 ^ (v[7] ^ 0xffffffff) & uVar6) + uVar4;
    v[6] = iVar1 + uVar5;
    v[2] = ((v[3] >> 2 | v[3] * 0x40000000) ^ (v[3] >> 0xd | v[3] * 0x80000) ^
           (v[3] >> 0x16 | v[3] * 0x400)) + (v[3] & uVar9 ^ v[3] & uVar7 ^ uVar9 & uVar7) + iVar1;
    if (j == 0) {
      local_68 = ctx->wbuf[0xe];
    }
    else {
      local_68 = ((ctx->wbuf[0xc] >> 0x11 | ctx->wbuf[0xc] << 0xf) ^
                  (ctx->wbuf[0xc] >> 0x13 | ctx->wbuf[0xc] << 0xd) ^ ctx->wbuf[0xc] >> 10) +
                 ctx->wbuf[7] +
                 ((ctx->wbuf[0xf] >> 7 | ctx->wbuf[0xf] << 0x19) ^
                  (ctx->wbuf[0xf] >> 0x12 | ctx->wbuf[0xf] << 0xe) ^ ctx->wbuf[0xf] >> 3) +
                 ctx->wbuf[0xe];
      ctx->wbuf[0xe] = local_68;
    }
    iVar1 = local_68 + k256[j + 0xe] +
            ((v[6] >> 6 | v[6] * 0x4000000) ^ (v[6] >> 0xb | v[6] * 0x200000) ^
            (v[6] >> 0x19 | v[6] * 0x80)) + (v[6] & v[7] ^ (v[6] ^ 0xffffffff) & uVar8) + uVar6;
    v[5] = iVar1 + uVar7;
    v[1] = ((v[2] >> 2 | v[2] * 0x40000000) ^ (v[2] >> 0xd | v[2] * 0x80000) ^
           (v[2] >> 0x16 | v[2] * 0x400)) + (v[2] & v[3] ^ v[2] & uVar9 ^ v[3] & uVar9) + iVar1;
    if (j == 0) {
      local_6c = ctx->wbuf[0xf];
    }
    else {
      local_6c = ((ctx->wbuf[0xd] >> 0x11 | ctx->wbuf[0xd] << 0xf) ^
                  (ctx->wbuf[0xd] >> 0x13 | ctx->wbuf[0xd] << 0xd) ^ ctx->wbuf[0xd] >> 10) +
                 ctx->wbuf[8] +
                 ((ctx->wbuf[0] >> 7 | ctx->wbuf[0] << 0x19) ^
                  (ctx->wbuf[0] >> 0x12 | ctx->wbuf[0] << 0xe) ^ ctx->wbuf[0] >> 3) + ctx->wbuf[0xf]
      ;
      ctx->wbuf[0xf] = local_6c;
    }
    iVar1 = local_6c + k256[j + 0xf] +
            ((v[5] >> 6 | v[5] * 0x4000000) ^ (v[5] >> 0xb | v[5] * 0x200000) ^
            (v[5] >> 0x19 | v[5] * 0x80)) + (v[5] & v[6] ^ (v[5] ^ 0xffffffff) & v[7]) + uVar8;
    v[4] = iVar1 + uVar9;
    v[0] = ((v[1] >> 2 | v[1] * 0x40000000) ^ (v[1] >> 0xd | v[1] * 0x80000) ^
           (v[1] >> 0x16 | v[1] * 0x400)) + (v[1] & v[2] ^ v[1] & v[3] ^ v[2] & v[3]) + iVar1;
  }
  ctx->hash[0] = v[0] + ctx->hash[0];
  ctx->hash[1] = v[1] + ctx->hash[1];
  ctx->hash[2] = v[2] + ctx->hash[2];
  ctx->hash[3] = v[3] + ctx->hash[3];
  ctx->hash[4] = v[4] + ctx->hash[4];
  ctx->hash[5] = v[5] + ctx->hash[5];
  ctx->hash[6] = v[6] + ctx->hash[6];
  ctx->hash[7] = v[7] + ctx->hash[7];
  return;
}

Assistant:

void sha256_compile(sha256_ctx ctx[1])
{   sha2_32t    v[8], j;

    memcpy(v, ctx->hash, 8 * sizeof(sha2_32t));

    for(j = 0; j < 64; j += 16)
    {
        h2_cycle( 0, j); h2_cycle( 1, j); h2_cycle( 2, j); h2_cycle( 3, j);
        h2_cycle( 4, j); h2_cycle( 5, j); h2_cycle( 6, j); h2_cycle( 7, j);
        h2_cycle( 8, j); h2_cycle( 9, j); h2_cycle(10, j); h2_cycle(11, j);
        h2_cycle(12, j); h2_cycle(13, j); h2_cycle(14, j); h2_cycle(15, j);
    }

    ctx->hash[0] += v[0]; ctx->hash[1] += v[1]; ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4]; ctx->hash[5] += v[5]; ctx->hash[6] += v[6]; ctx->hash[7] += v[7];
}